

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

void store_update(void)

{
  ushort uVar1;
  uint32_t uVar2;
  void *p;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  
  if ((player->opts).opt[0x1a] == true) {
    msg("Updating Shops...");
  }
  while (daycount != 0) {
    daycount = daycount - 1;
    if (z_info->store_max != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        if (*(int *)((long)&stores->feat + lVar5) != 0xe) {
          store_maint((store_conflict *)((long)&stores->owners + lVar5));
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x70;
      } while (uVar4 < z_info->store_max);
    }
    uVar2 = Rand_div((uint)z_info->store_shuffle);
    if (uVar2 == 0) {
      p = mem_zalloc((ulong)z_info->store_max << 2);
      if ((player->opts).opt[0x1a] == true) {
        msg("Shuffling a Shopkeeper...");
      }
      uVar1 = z_info->store_max;
      if ((ulong)uVar1 == 0) {
        uVar2 = 0;
      }
      else {
        piVar3 = &stores->feat;
        uVar4 = 0;
        uVar2 = 0;
        do {
          if (*piVar3 != 0xe) {
            *(int *)((long)p + (long)(int)uVar2 * 4) = (int)uVar4;
            uVar2 = uVar2 + 1;
          }
          uVar4 = uVar4 + 1;
          piVar3 = piVar3 + 0x1c;
        } while (uVar1 != uVar4);
      }
      if (0 < (int)uVar2) {
        uVar2 = Rand_div(uVar2);
        store_shuffle(stores + *(int *)((long)p + (long)(int)uVar2 * 4));
      }
      mem_free(p);
    }
  }
  daycount = 0;
  if ((player->opts).opt[0x1a] != true) {
    return;
  }
  msg("Done.");
  return;
}

Assistant:

void store_update(void)
{
	if (OPT(player, cheat_xtra)) msg("Updating Shops...");
	while (daycount--) {
		int n;

		/* Maintain each shop (except home) */
		for (n = 0; n < z_info->store_max; n++) {
			/* Skip the home */
			if (stores[n].feat == FEAT_HOME) continue;

			/* Maintain */
			store_maint(&stores[n]);
		}

		/* Sometimes, shuffle the shop-keepers */
		if (one_in_(z_info->store_shuffle)) {
			int *non_home_inds = mem_zalloc(z_info->store_max
				* sizeof(*non_home_inds));
			int n_without_home = 0;

			/* Message */
			if (OPT(player, cheat_xtra)) msg("Shuffling a Shopkeeper...");

			/* Pick a random shop (except home) */
			for (n = 0; n < z_info->store_max; n++) {
				if (stores[n].feat != FEAT_HOME) {
					non_home_inds[n_without_home] = n;
					++n_without_home;
				}
			}
			if (n_without_home > 0) {
				n = randint0(n_without_home);
				/* Then suffle it. */
				store_shuffle(&stores[non_home_inds[n]]);
			}
			mem_free(non_home_inds);
		}
	}
	daycount = 0;
	if (OPT(player, cheat_xtra)) msg("Done.");
}